

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  graphic g;
  value<int> m;
  
  mtrace();
  graphic::graphic(&g.super_graphic);
  lVar2 = mpt::graphic::create_layout();
  m._0_8_ = &PTR_convert_00105d18;
  m._val = 0;
  mpt::logger::default_instance();
  mpt::object::set((char *)(lVar2 + 0x18),"name",(logger *)"lay");
  iVar1 = mpt::graphic::add_layout((layout *)&g,SUB81(lVar2,0));
  mpt::graphic::hint::hint((hint *)&local_3c,iVar1,4,3);
  graphic::register_update(&g.super_graphic,lVar2,local_3c);
  mpt::graphic::hint::hint((hint *)&local_40,iVar1,6,8);
  graphic::register_update(&g.super_graphic,lVar2,local_40);
  mpt::graphic::hint::hint((hint *)&local_44,iVar1,4,-1);
  graphic::register_update(&g.super_graphic,lVar2,local_44);
  mpt::graphic::hint::hint((hint *)&local_48,iVar1,4,-1);
  graphic::register_update(&g.super_graphic,&m,local_48);
  graphic::dispatch_updates(&g.super_graphic);
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
            (&g.super_updates<const_mpt::convertable_*,_mpt::graphic::hint>,0);
  mpt::graphic::remove_layout((layout *)&g);
  graphic::~graphic(&g.super_graphic);
  return 0;
}

Assistant:

int main()
{
	mtrace();
	
	graphic g;
	
	mpt::layout *l = g.create_layout();
	mpt::metatype::value<int> m(0);
	
	l->set("name", "lay");
	
	int pos = g.add_layout(l);
	g.register_update(l,  mpt::graphic::hint(pos, 4, 3));
	g.register_update(l,  mpt::graphic::hint(pos, 6, 8)); // unique hint
	g.register_update(l,  mpt::graphic::hint(pos, 4));    // overrides specific entry
	g.register_update(&m, mpt::graphic::hint(pos, 4));    // different data value
	
	g.dispatch_updates();
	g.compress();
	
	g.remove_layout(l);
}